

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

_Bool Curl_conncache_return_conn(Curl_easy *data,connectdata *conn)

{
  size_t sVar1;
  connectdata *conn_00;
  connectdata *pcVar2;
  ulong uVar3;
  curltime cVar4;
  
  uVar3 = data->multi->maxconnects;
  if ((long)uVar3 < 0) {
    uVar3 = (long)data->multi->num_easy << 2;
  }
  cVar4 = Curl_now();
  (conn->lastused).tv_sec = cVar4.tv_sec;
  (conn->lastused).tv_usec = cVar4.tv_usec;
  if (uVar3 != 0) {
    sVar1 = Curl_conncache_size(data);
    if (uVar3 < sVar1) {
      Curl_infof(data,"Connection cache is full, closing the oldest one");
      conn_00 = Curl_conncache_extract_oldest(data);
      pcVar2 = (connectdata *)0x0;
      if (conn_00 != (connectdata *)0x0) {
        Curl_disconnect(data,conn_00,false);
        pcVar2 = conn_00;
      }
      goto LAB_005f165e;
    }
  }
  pcVar2 = (connectdata *)0x0;
LAB_005f165e:
  return pcVar2 != conn;
}

Assistant:

bool Curl_conncache_return_conn(struct Curl_easy *data,
                                struct connectdata *conn)
{
  /* data->multi->maxconnects can be negative, deal with it. */
  size_t maxconnects =
    (data->multi->maxconnects < 0) ? data->multi->num_easy * 4:
    data->multi->maxconnects;
  struct connectdata *conn_candidate = NULL;

  conn->lastused = Curl_now(); /* it was used up until now */
  if(maxconnects > 0 &&
     Curl_conncache_size(data) > maxconnects) {
    infof(data, "Connection cache is full, closing the oldest one");

    conn_candidate = Curl_conncache_extract_oldest(data);
    if(conn_candidate) {
      /* the winner gets the honour of being disconnected */
      Curl_disconnect(data, conn_candidate, /* dead_connection */ FALSE);
    }
  }

  return (conn_candidate == conn) ? FALSE : TRUE;

}